

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::LoadDataShare(Alice *this)

{
  pointer *this_00;
  byte bVar1;
  iterator __first;
  iterator __last;
  size_type sVar2;
  int local_264;
  undefined1 local_260 [4];
  int j;
  vector<long,_std::allocator<long>_> Element;
  long local_238;
  long temp;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  R;
  ifstream fin;
  Alice *this_local;
  
  this_00 = &R.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::ifstream::ifstream(this_00,"../inputs/alice/D_A.txt",8);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&temp);
  std::istream::operator>>((istream *)this_00,&local_238);
  while( true ) {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_260);
    for (local_264 = 0; local_264 < 2; local_264 = local_264 + 1) {
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)local_260,&local_238);
      std::istream::operator>>
                ((istream *)
                 &R.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_238);
    }
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)&temp,(value_type *)local_260);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_260);
  }
  __first = std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     *)&temp);
  __last = std::
           vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)&temp);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  assign<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,void>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&(this->super_Party).D,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )__last._M_current);
  sVar2 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::size(&(this->super_Party).D);
  (this->super_Party).n_d = (int)sVar2;
  std::ifstream::close();
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&temp);
  std::ifstream::~ifstream
            (&R.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Alice::LoadDataShare()
{
    std::ifstream fin("../inputs/alice/D_A.txt");
    std::vector<std::vector<long>> R;
    long temp;
    fin>>temp;
    while(!fin.eof())
    {
        std::vector<long> Element;
        for (int j = 0; j < 2; j++)
        {
            Element.push_back(temp);
            fin >> temp;
        }
        R.push_back(Element);
    }
    D.assign(R.begin(), R.end());
    n_d = D.size();
    fin.close();
}